

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::CrossLinkMessage
          (DescriptorBuilder *this,Descriptor *message,DescriptorProto *proto)

{
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *this_00;
  Descriptor *pDVar1;
  undefined8 *puVar2;
  char *pcVar3;
  size_t sVar4;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  anon_union_216_1_493b367e_for_DescriptorProto_4 *paVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  bool bVar8;
  int iVar9;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>_>
  *proto_00;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>_>
  *pVVar10;
  FieldDescriptor *pFVar11;
  OneofDescriptor *pOVar12;
  string *psVar13;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::OneofDescriptorProto>_>
  *pVVar14;
  int i_1;
  int iVar15;
  int iVar16;
  long lVar17;
  int i_2;
  int i;
  long lVar18;
  string_view element_name;
  string_view element_name_00;
  string_view element_name_01;
  string_view element_name_02;
  int local_12c;
  Descriptor *message_local;
  DescriptorProto *local_120;
  OneofDescriptor *oneof_decl;
  RepeatedPtrFieldBase *local_110;
  undefined1 local_108 [40];
  code *pcStack_e0;
  AlphaNum local_d8;
  Descriptor **local_a8;
  int *local_a0;
  OneofDescriptor **local_98;
  AlphaNum local_90;
  size_type local_60;
  pointer local_58;
  
  lVar17 = 0;
  message_local = message;
  local_120 = proto;
  for (lVar18 = 0; lVar18 < message->nested_type_count_; lVar18 = lVar18 + 1) {
    pDVar1 = message->nested_types_;
    proto_00 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                         (&(proto->field_0)._impl_.nested_type_.super_RepeatedPtrFieldBase,
                          (int)lVar18);
    CrossLinkMessage(this,(Descriptor *)(&pDVar1->super_SymbolBase + lVar17),proto_00);
    lVar17 = lVar17 + 0x98;
  }
  this_00 = &(local_120->field_0)._impl_.field_;
  lVar18 = 0;
  for (lVar17 = 0; lVar17 < message->field_count_; lVar17 = lVar17 + 1) {
    pFVar11 = message->fields_;
    pVVar10 = internal::RepeatedPtrFieldBase::
              Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                        (&this_00->super_RepeatedPtrFieldBase,(int)lVar17);
    CrossLinkField(this,(FieldDescriptor *)(&pFVar11->super_SymbolBase + lVar18),pVVar10);
    lVar18 = lVar18 + 0x58;
  }
  paVar5 = &local_120->field_0;
  lVar18 = 0;
  lVar17 = 0;
  local_110 = &this_00->super_RepeatedPtrFieldBase;
  for (; lVar17 < message->extension_count_; lVar17 = lVar17 + 1) {
    pFVar11 = message->extensions_;
    pVVar10 = internal::RepeatedPtrFieldBase::
              Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                        (&(paVar5->_impl_).extension_.super_RepeatedPtrFieldBase,(int)lVar17);
    CrossLinkField(this,(FieldDescriptor *)(&pFVar11->super_SymbolBase + lVar18),pVVar10);
    lVar18 = lVar18 + 0x58;
  }
  for (local_12c = 0; local_12c < message->field_count_; local_12c = local_12c + 1) {
    pFVar11 = Descriptor::field(message,local_12c);
    oneof_decl = FieldDescriptor::containing_oneof(pFVar11);
    if (oneof_decl != (OneofDescriptor *)0x0) {
      if (0 < oneof_decl->field_count_) {
        pFVar11 = Descriptor::field(message_local,local_12c + -1);
        pOVar12 = FieldDescriptor::containing_oneof(pFVar11);
        if (pOVar12 != oneof_decl) {
          local_d8.piece_._M_str = message_local->all_names_[1]._M_dataplus._M_p;
          local_d8.piece_._M_len = message_local->all_names_[1]._M_string_length;
          local_90.piece_ = absl::lts_20240722::NullSafeStringView(".");
          pFVar11 = Descriptor::field(message_local,local_12c + -1);
          local_58 = (pFVar11->all_names_->_M_dataplus)._M_p;
          local_60 = pFVar11->all_names_->_M_string_length;
          absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_108,&local_d8,&local_90);
          uVar7 = local_108._8_8_;
          uVar6 = local_108._0_8_;
          pVVar10 = internal::RepeatedPtrFieldBase::
                    Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                              (local_110,local_12c + -1);
          local_a8 = &message_local;
          local_a0 = &local_12c;
          local_98 = &oneof_decl;
          pcStack_e0 = absl::lts_20240722::functional_internal::
                       InvokeObject<google::protobuf::DescriptorBuilder::CrossLinkMessage(google::protobuf::Descriptor*,google::protobuf::DescriptorProto_const&)::__0,std::__cxx11::string>
          ;
          local_108._32_8_ = &local_a8;
          make_error.invoker_ =
               absl::lts_20240722::functional_internal::
               InvokeObject<google::protobuf::DescriptorBuilder::CrossLinkMessage(google::protobuf::Descriptor*,google::protobuf::DescriptorProto_const&)::__0,std::__cxx11::string>
          ;
          make_error.ptr_.obj = (void *)local_108._32_8_;
          element_name._M_str = (char *)uVar6;
          element_name._M_len = uVar7;
          AddError(this,element_name,&pVVar10->super_Message,TYPE,make_error);
          std::__cxx11::string::~string((string *)local_108);
        }
      }
      pOVar12 = message_local->oneof_decls_;
      iVar16 = (int)(((long)oneof_decl - (long)oneof_decl->containing_type_->oneof_decls_) / 0x38);
      iVar15 = pOVar12[iVar16].field_count_;
      if (iVar15 == 0) {
        pFVar11 = Descriptor::field(message_local,local_12c);
        pOVar12[iVar16].fields_ = pFVar11;
        iVar15 = pOVar12[iVar16].field_count_;
      }
      if (this->had_errors_ == false) {
        local_d8.piece_._M_len = (size_t)(pOVar12[iVar16].fields_ + iVar15);
        pFVar11 = Descriptor::field(message_local,local_12c);
        local_90.piece_._M_len = (size_t)pFVar11;
        psVar13 = absl::lts_20240722::log_internal::
                  Check_EQImpl<google::protobuf::FieldDescriptor_const*,google::protobuf::FieldDescriptor_const*>
                            ((FieldDescriptor **)&local_d8,(FieldDescriptor **)&local_90,
                             "out_oneof_decl.fields_ + out_oneof_decl.field_count_ == message->field(i)"
                            );
        if (psVar13 != (string *)0x0) {
          absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_d8,
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/descriptor.cc"
                     ,0x1c8c,psVar13->_M_string_length,(psVar13->_M_dataplus)._M_p);
          absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&local_d8);
        }
        iVar15 = pOVar12[iVar16].field_count_;
      }
      pOVar12[iVar16].field_count_ = iVar15 + 1;
    }
    message = message_local;
  }
  local_120 = (DescriptorProto *)&(local_120->field_0)._impl_.oneof_decl_;
  lVar17 = 8;
  for (lVar18 = 0; lVar18 < message->oneof_decl_count_; lVar18 = lVar18 + 1) {
    pOVar12 = message->oneof_decls_;
    if (*(int *)((long)pOVar12 + lVar17 + -4) == 0) {
      local_d8.piece_._M_str = message->all_names_[1]._M_dataplus._M_p;
      local_d8.piece_._M_len = message->all_names_[1]._M_string_length;
      local_90.piece_ = absl::lts_20240722::NullSafeStringView(".");
      puVar2 = *(undefined8 **)(&pOVar12->super_SymbolBase + lVar17);
      local_58 = (pointer)*puVar2;
      local_60 = puVar2[1];
      absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_108,&local_d8,&local_90);
      uVar7 = local_108._8_8_;
      uVar6 = local_108._0_8_;
      pVVar14 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::OneofDescriptorProto>>
                          ((RepeatedPtrFieldBase *)local_120,(int)lVar18);
      element_name_00._M_str = (char *)uVar6;
      element_name_00._M_len = uVar7;
      AddError(this,element_name_00,&pVVar14->super_Message,NAME,
               "Oneof must have at least one field.");
      std::__cxx11::string::~string((string *)local_108);
      message = message_local;
    }
    lVar17 = lVar17 + 0x38;
  }
  iVar15 = 0;
  do {
    if (message->field_count_ <= iVar15) {
      iVar15 = -1;
      for (iVar16 = 0; iVar16 < message->oneof_decl_count_; iVar16 = iVar16 + 1) {
        pOVar12 = Descriptor::oneof_decl(message,iVar16);
        bVar8 = OneofDescriptor::is_synthetic(pOVar12);
        if (bVar8) {
          iVar9 = iVar15;
          if (iVar15 == -1) {
            iVar9 = iVar16;
          }
        }
        else {
          iVar9 = -1;
          if (iVar15 != -1) {
            pcVar3 = message_local->all_names_[1]._M_dataplus._M_p;
            sVar4 = message_local->all_names_[1]._M_string_length;
            pVVar14 = internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::OneofDescriptorProto>>
                                ((RepeatedPtrFieldBase *)local_120,iVar16);
            element_name_02._M_str = pcVar3;
            element_name_02._M_len = sVar4;
            AddError(this,element_name_02,&pVVar14->super_Message,OTHER,
                     "Synthetic oneofs must be after all other oneofs");
            iVar9 = iVar15;
          }
        }
        message = message_local;
        iVar15 = iVar9;
      }
      iVar16 = message->oneof_decl_count_;
      if (iVar15 != -1) {
        iVar16 = iVar15;
      }
      message->real_oneof_decl_count_ = iVar16;
      return;
    }
    pFVar11 = Descriptor::field(message,iVar15);
    if ((pFVar11->field_0x1 & 2) != 0) {
      pOVar12 = FieldDescriptor::containing_oneof(pFVar11);
      if (pOVar12 != (OneofDescriptor *)0x0) {
        pOVar12 = FieldDescriptor::containing_oneof(pFVar11);
        bVar8 = OneofDescriptor::is_synthetic(pOVar12);
        if (bVar8) goto LAB_001cdab6;
      }
      pcVar3 = message_local->all_names_[1]._M_dataplus._M_p;
      sVar4 = message_local->all_names_[1]._M_string_length;
      pVVar10 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                          (local_110,iVar15);
      element_name_01._M_str = pcVar3;
      element_name_01._M_len = sVar4;
      AddError(this,element_name_01,&pVVar10->super_Message,OTHER,
               "Fields with proto3_optional set must be a member of a one-field oneof");
    }
LAB_001cdab6:
    iVar15 = iVar15 + 1;
    message = message_local;
  } while( true );
}

Assistant:

void DescriptorBuilder::CrossLinkMessage(Descriptor* message,
                                         const DescriptorProto& proto) {
  for (int i = 0; i < message->nested_type_count(); i++) {
    CrossLinkMessage(&message->nested_types_[i], proto.nested_type(i));
  }

  for (int i = 0; i < message->field_count(); i++) {
    CrossLinkField(&message->fields_[i], proto.field(i));
  }

  for (int i = 0; i < message->extension_count(); i++) {
    CrossLinkField(&message->extensions_[i], proto.extension(i));
  }

  // Set up field array for each oneof.

  // First count the number of fields per oneof.
  for (int i = 0; i < message->field_count(); i++) {
    const OneofDescriptor* oneof_decl = message->field(i)->containing_oneof();
    if (oneof_decl != nullptr) {
      // Make sure fields belonging to the same oneof are defined consecutively.
      // This enables optimizations in codegens and reflection libraries to
      // skip fields in the oneof group, as only one of the field can be set.
      // Note that field_count() returns how many fields in this oneof we have
      // seen so far. field_count() > 0 guarantees that i > 0, so field(i-1) is
      // safe.
      if (oneof_decl->field_count() > 0 &&
          message->field(i - 1)->containing_oneof() != oneof_decl) {
        AddError(
            absl::StrCat(message->full_name(), ".",
                         message->field(i - 1)->name()),
            proto.field(i - 1), DescriptorPool::ErrorCollector::TYPE, [&] {
              return absl::Substitute(
                  "Fields in the same oneof must be defined consecutively. "
                  "\"$0\" cannot be defined before the completion of the "
                  "\"$1\" oneof definition.",
                  message->field(i - 1)->name(), oneof_decl->name());
            });
      }
      // Must go through oneof_decls_ array to get a non-const version of the
      // OneofDescriptor.
      auto& out_oneof_decl = message->oneof_decls_[oneof_decl->index()];
      if (out_oneof_decl.field_count_ == 0) {
        out_oneof_decl.fields_ = message->field(i);
      }

      if (!had_errors_) {
        // Verify that they are contiguous.
        // This is assumed by OneofDescriptor::field(i).
        // But only if there are no errors.
        ABSL_CHECK_EQ(out_oneof_decl.fields_ + out_oneof_decl.field_count_,
                      message->field(i));
      }
      ++out_oneof_decl.field_count_;
    }
  }

  // Then verify the sizes.
  for (int i = 0; i < message->oneof_decl_count(); i++) {
    OneofDescriptor* oneof_decl = &message->oneof_decls_[i];

    if (oneof_decl->field_count() == 0) {
      AddError(absl::StrCat(message->full_name(), ".", oneof_decl->name()),
               proto.oneof_decl(i), DescriptorPool::ErrorCollector::NAME,
               "Oneof must have at least one field.");
    }
  }

  for (int i = 0; i < message->field_count(); i++) {
    const FieldDescriptor* field = message->field(i);
    if (field->proto3_optional_) {
      if (!field->containing_oneof() ||
          !field->containing_oneof()->is_synthetic()) {
        AddError(message->full_name(), proto.field(i),
                 DescriptorPool::ErrorCollector::OTHER,
                 "Fields with proto3_optional set must be "
                 "a member of a one-field oneof");
      }
    }
  }

  // Synthetic oneofs must be last.
  int first_synthetic = -1;
  for (int i = 0; i < message->oneof_decl_count(); i++) {
    if (message->oneof_decl(i)->is_synthetic()) {
      if (first_synthetic == -1) {
        first_synthetic = i;
      }
    } else {
      if (first_synthetic != -1) {
        AddError(message->full_name(), proto.oneof_decl(i),
                 DescriptorPool::ErrorCollector::OTHER,
                 "Synthetic oneofs must be after all other oneofs");
      }
    }
  }

  if (first_synthetic == -1) {
    message->real_oneof_decl_count_ = message->oneof_decl_count_;
  } else {
    message->real_oneof_decl_count_ = first_synthetic;
  }
}